

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O2

void __thiscall
moira::Moira::dasmMove6<(moira::Instr)71,(moira::Mode)5,(moira::Size)1>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  StrWriter *pSVar1;
  Ea<(moira::Mode)6,_(moira::Size)1> dst;
  Ea<(moira::Mode)5,_(moira::Size)1> src;
  Ea<(moira::Mode)6,_(moira::Size)1> EStack_58;
  Ea<(moira::Mode)5,_(moira::Size)1> local_44;
  
  local_44.reg = op & 7;
  local_44.pc = *addr;
  local_44.ext1 = dasmRead<(moira::Size)2>(this,addr);
  Op<(moira::Mode)6,(moira::Size)1>(&EStack_58,this,op >> 9 & 7,addr);
  pSVar1 = StrWriter::operator<<(str);
  pSVar1 = StrWriter::operator<<(pSVar1);
  StrWriter::operator<<(pSVar1,(Align)(this->tab).raw);
  pSVar1 = StrWriter::operator<<(pSVar1,&local_44);
  StrWriter::operator<<(pSVar1,", ");
  StrWriter::operator<<(pSVar1,&EStack_58);
  return;
}

Assistant:

void
Moira::dasmMove6(StrWriter &str, u32 &addr, u16 op)
{
    auto src = Op <M,S>       ( _____________xxx(op), addr );
    auto dst = Op <MODE_IX,S> ( ____xxx_________(op), addr );

    str << Ins<I>{} << Sz<S>{} << tab << src << ", " << dst;
}